

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

int skip_mode_by_low_temp
              (PREDICTION_MODE mode,MV_REFERENCE_FRAME ref_frame,BLOCK_SIZE bsize,
              CONTENT_STATE_SB content_state_sb,int_mv mv,int force_skip_low_temp_var)

{
  BLOCK_SIZE bsize_local;
  MV_REFERENCE_FRAME ref_frame_local;
  PREDICTION_MODE mode_local;
  int_mv mv_local;
  CONTENT_STATE_SB content_state_sb_local;
  undefined4 local_4;
  
  if (((force_skip_low_temp_var == 0) || (ref_frame == '\x01')) || (mv.as_int == 0)) {
    content_state_sb_local.source_sad_nonrd = content_state_sb.source_sad_nonrd;
    if (((content_state_sb_local.source_sad_nonrd == kHighSad) || (bsize < BLOCK_64X64)) ||
       ((force_skip_low_temp_var == 0 || (mode != '\x10')))) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static inline int skip_mode_by_low_temp(
    PREDICTION_MODE mode, MV_REFERENCE_FRAME ref_frame, BLOCK_SIZE bsize,
    CONTENT_STATE_SB content_state_sb, int_mv mv, int force_skip_low_temp_var) {
  // Skip non-zeromv mode search for non-LAST frame if force_skip_low_temp_var
  // is set. If nearestmv for golden frame is 0, zeromv mode will be skipped
  // later.
  if (force_skip_low_temp_var && ref_frame != LAST_FRAME && mv.as_int != 0) {
    return 1;
  }

  if (content_state_sb.source_sad_nonrd != kHighSad && bsize >= BLOCK_64X64 &&
      force_skip_low_temp_var && mode == NEWMV) {
    return 1;
  }
  return 0;
}